

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int libssh2_sftp_rename_ex
              (LIBSSH2_SFTP *sftp,char *source_filename,uint source_filename_len,char *dest_filename
              ,uint dest_filename_len,long flags)

{
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar1;
  uchar **buf;
  uint32_t uVar2;
  int iVar3;
  ulong uVar4;
  uchar *puVar5;
  char *errmsg;
  uint32_t uVar6;
  uint uVar7;
  size_t data_len;
  uchar *local_78;
  uchar **local_70;
  size_t local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  char *local_48;
  char *local_40;
  time_t local_38;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    iVar3 = -0x27;
  }
  else {
    local_60 = flags;
    local_48 = source_filename;
    local_40 = dest_filename;
    local_38 = time((time_t *)0x0);
    local_70 = &sftp->rename_s;
    local_58 = (ulong)dest_filename_len;
    local_50 = (ulong)source_filename_len;
    do {
      channel = sftp->channel;
      pLVar1 = channel->session;
      local_68 = 0;
      uVar7 = source_filename_len + dest_filename_len + 0x11 + (uint)(4 < sftp->version) * 4;
      local_78 = (uchar *)0x0;
      if (sftp->rename_state == libssh2_NB_state_idle) {
        sftp->last_errno = 0;
        if (sftp->version < 2) {
          uVar6 = 0xffffffe1;
          errmsg = "Server does not support RENAME";
        }
        else {
          puVar5 = (uchar *)(*pLVar1->alloc)((size_t)uVar7,&pLVar1->abstract);
          buf = local_70;
          sftp->rename_packet = puVar5;
          sftp->rename_s = puVar5;
          if (puVar5 != (uchar *)0x0) {
            _libssh2_store_u32(local_70,uVar7 - 4);
            puVar5 = sftp->rename_s;
            sftp->rename_s = puVar5 + 1;
            *puVar5 = '\x12';
            uVar6 = sftp->request_id;
            sftp->request_id = uVar6 + 1;
            sftp->rename_request_id = uVar6;
            _libssh2_store_u32(buf,uVar6);
            _libssh2_store_str(buf,local_48,local_50);
            _libssh2_store_str(buf,local_40,local_58);
            if (4 < sftp->version) {
              _libssh2_store_u32(local_70,(uint32_t)local_60);
            }
            sftp->rename_state = libssh2_NB_state_created;
            goto LAB_00125a59;
          }
          uVar6 = 0xfffffffa;
          errmsg = "Unable to allocate memory for FXP_RENAME packet";
        }
        goto LAB_00125ca4;
      }
LAB_00125a59:
      if (sftp->rename_state == libssh2_NB_state_created) {
        uVar4 = _libssh2_channel_write
                          (channel,0,sftp->rename_packet,
                           (long)sftp->rename_s - (long)sftp->rename_packet);
        uVar2 = 0xffffffdb;
        if (uVar4 != 0xffffffffffffffdb) {
          (*pLVar1->free)(sftp->rename_packet,&pLVar1->abstract);
          sftp->rename_packet = (uchar *)0x0;
          if (uVar4 != uVar7) {
            sftp->rename_state = libssh2_NB_state_idle;
            uVar6 = 0xfffffff9;
            errmsg = "Unable to send FXP_RENAME command";
            goto LAB_00125ca4;
          }
          sftp->rename_state = libssh2_NB_state_sent;
          goto LAB_00125ac6;
        }
      }
      else {
LAB_00125ac6:
        uVar2 = sftp_packet_require(sftp,'e',sftp->rename_request_id,&local_78,&local_68,9);
        if (uVar2 == 0) {
          sftp->rename_state = libssh2_NB_state_idle;
          uVar2 = _libssh2_ntohu32(local_78 + 5);
          (*pLVar1->free)(local_78,&pLVar1->abstract);
          sftp->last_errno = uVar2;
          if (uVar2 != 0) {
            uVar6 = 0xffffffe1;
            if (uVar2 == 8) {
              errmsg = "Operation Not Supported";
            }
            else if (uVar2 == 0xb) {
              errmsg = "File already exists and SSH_FXP_RENAME_OVERWRITE not specified";
            }
            else {
              errmsg = "SFTP Protocol Error";
            }
            goto LAB_00125ca4;
          }
        }
        else if (uVar2 != 0xffffffdb) {
          if (uVar2 == 0xffffffda) {
            if (local_68 != 0) {
              (*pLVar1->free)(local_78,&pLVar1->abstract);
            }
            errmsg = "SFTP rename packet too short";
            uVar6 = 0xffffffe1;
          }
          else {
            sftp->rename_state = libssh2_NB_state_idle;
            errmsg = "Error waiting for FXP STATUS";
            uVar6 = uVar2;
          }
LAB_00125ca4:
          uVar2 = _libssh2_error(pLVar1,uVar6,errmsg);
        }
      }
      if (uVar2 != 0xffffffdb) {
        return uVar2;
      }
      pLVar1 = sftp->channel->session;
      if (pLVar1->api_block_mode == 0) {
        return -0x25;
      }
      iVar3 = _libssh2_wait_socket(pLVar1,local_38);
    } while (iVar3 == 0);
  }
  return iVar3;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_rename_ex(LIBSSH2_SFTP *sftp, const char *source_filename,
                       unsigned int source_filename_len,
                       const char *dest_filename,
                       unsigned int dest_filename_len, long flags)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_rename(sftp, source_filename, source_filename_len,
                             dest_filename, dest_filename_len, flags));
    return rc;
}